

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Problem_CGBG_FF::TypeIndexToObservationIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Problem_CGBG_FF *this,Index agI,Index typeI)

{
  const_reference pvVar1;
  allocator_type local_19;
  
  pvVar1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->_m_houseIndices_obs,(ulong)agI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 2,&local_19);
  TypeIndexToObservationIndices(this,typeI,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

vector<Index> Problem_CGBG_FF::TypeIndexToObservationIndices(
        Index agI, Index typeI) const
{
    const vector<Index> & obsHouseIndices = _m_houseIndices_obs.at(agI);
    vector<Index> obsIndices(obsHouseIndices.size());
    TypeIndexToObservationIndices(typeI, obsIndices);
    return obsIndices;
}